

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::Serializer::AddDirectBytes(Serializer *this,ByteData256 *buffer)

{
  uchar *buffer_00;
  size_type sVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  ByteData256 *buffer_local;
  Serializer *this_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)buffer;
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,buffer);
  buffer_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_30);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_30);
  AddDirectBytes(this,buffer_00,(uint32_t)sVar1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_30);
  return;
}

Assistant:

void Serializer::AddDirectBytes(const ByteData256& buffer) {
  auto buf = buffer.GetBytes();
  AddDirectBytes(buf.data(), static_cast<uint32_t>(buf.size()));
}